

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

void __thiscall TPZMHMeshControl::DivideWrap(TPZMHMeshControl *this,TPZGeoEl *wrapelement)

{
  TPZGeoElSide *__return_storage_ptr__;
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  ostream *poVar5;
  int is;
  ulong uVar6;
  TPZGeoEl *pTVar7;
  long lVar8;
  TPZAutoPointer<TPZRefPattern> *this_00;
  int iVar9;
  TPZAutoPointer<TPZRefPattern> siderefpattern_1;
  TPZGeoElSide neighbour;
  TPZStack<TPZGeoEl_*,_10> subels;
  TPZGeoElSide gelside;
  TPZStack<TPZGeoElSide,_10> subelsides;
  undefined1 local_228 [48];
  TPZCompMesh *local_1f8;
  uint local_1f0;
  undefined **local_1e8;
  undefined1 local_1e0 [112];
  undefined1 local_170 [24];
  TPZGeoElSide local_158;
  TPZStack<TPZGeoElSide,_10> local_140;
  
  this_00 = (TPZAutoPointer<TPZRefPattern> *)local_228;
  local_228._16_8_ = this;
  iVar1 = (**(code **)(*(long *)wrapelement + 0xf0))(wrapelement);
  local_158.fSide = iVar1 - 1;
  local_1e8 = &PTR__TPZGeoElSide_0172da80;
  local_158.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  local_158.fGeoEl = wrapelement;
  iVar1 = TPZGeoElSide::Dimension(&local_158);
  __return_storage_ptr__ = (TPZGeoElSide *)(local_228 + 0x28);
  TPZGeoElSide::Neighbour(__return_storage_ptr__,&local_158);
  while( true ) {
    if ((local_1f8 == (TPZCompMesh *)local_158.fGeoEl) && (local_1f0 == local_158.fSide)) {
      return;
    }
    iVar2 = (**(code **)(*(long *)local_1f8 + 0x1d0))();
    if ((iVar2 != 0) && (iVar2 = TPZGeoElSide::NSubElements(__return_storage_ptr__), 1 < iVar2))
    break;
    TPZGeoElSide::Neighbour((TPZGeoElSide *)&local_140,__return_storage_ptr__);
    local_1f0 = (uint)local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                      fNElements;
    local_1f8 = (TPZCompMesh *)
                local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.fStore;
  }
  local_228._8_8_ = wrapelement;
  TPZStack<TPZGeoElSide,_10>::TPZStack(&local_140);
  TPZGeoElSide::GetSubElements2((TPZGeoElSide *)(local_228 + 0x28),&local_140);
  uVar6 = 0;
  uVar4 = (ulong)(uint)local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                       fNElements;
  if ((int)(uint)local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>.
                 fNElements < 1) {
    uVar4 = uVar6;
  }
  iVar2 = 0;
  iVar9 = 0;
  for (; uVar4 * 0x18 - uVar6 != 0; uVar6 = uVar6 + 0x18) {
    iVar3 = TPZGeoElSide::Dimension
                      ((TPZGeoElSide *)
                       ((long)(((TPZAdmChunkVector<TPZCompEl_*,_10> *)
                               ((long)local_140.super_TPZManVector<TPZGeoElSide,_10>.
                                      super_TPZVec<TPZGeoElSide>.fStore + 0x40))->
                              super_TPZChunkVector<TPZCompEl_*,_10>).fVec.fExtAlloc + (uVar6 - 0x70)
                       ));
    if (iVar3 == iVar1) {
      local_170._0_8_ = local_1e8;
      local_170._16_4_ =
           *(undefined4 *)
            ((long)(((TPZAdmChunkVector<TPZCompEl_*,_10> *)
                    ((long)local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>
                           .fStore + 0x40))->super_TPZChunkVector<TPZCompEl_*,_10>).fVec.fExtAlloc +
            (uVar6 - 0x60));
      local_170._8_8_ =
           *(size_type *)
            ((long)(((TPZAdmChunkVector<TPZCompEl_*,_10> *)
                    ((long)local_140.super_TPZManVector<TPZGeoElSide,_10>.super_TPZVec<TPZGeoElSide>
                           .fStore + 0x40))->super_TPZChunkVector<TPZCompEl_*,_10>).fVec.fExtAlloc +
            (uVar6 - 0x68));
      iVar3 = HasWrapNeighbour((TPZMHMeshControl *)local_228._16_8_,(TPZGeoElSide *)local_170);
      iVar9 = iVar9 + 1;
      iVar2 = (iVar2 + 1) - (uint)(iVar3 == 0);
    }
  }
  if (iVar2 != iVar9 && iVar2 != 0) {
    std::operator<<((ostream *)&std::cout,"I don\'t understand\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
               ,0x9fd);
  }
  if (iVar2 != 0) goto LAB_011ea1f5;
  iVar1 = TPZGeoElSide::NSides((TPZGeoElSide *)(local_228 + 0x28));
  if (local_1f0 == iVar1 - 1U) {
    (**(code **)(*(long *)local_1f8 + 0x2b0))(local_1e0);
    pTVar7 = (TPZGeoEl *)local_228._8_8_;
    if (((long *)local_1e0._0_8_ == (long *)0x0) || (*(long *)local_1e0._0_8_ == 0)) {
      poVar5 = std::operator<<((ostream *)&std::cout,"void TPZMHMeshControl::DivideWrap(TPZGeoEl *)"
                              );
      std::operator<<(poVar5," We expect elements to have refinement patterns\n");
    }
    else {
      local_228._32_8_ = local_1e0._0_8_;
      LOCK();
      *(int *)(local_1e0._0_8_ + 8) = (int)*(long *)(local_1e0._0_8_ + 8) + 1;
      UNLOCK();
      (**(code **)(*(long *)local_228._8_8_ + 0x2a8))(local_228._8_8_);
      this_00 = (TPZAutoPointer<TPZRefPattern> *)(local_228 + 0x20);
LAB_011ea158:
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer(this_00);
    }
  }
  else {
    (**(code **)(*(long *)local_1f8 + 0x2b0))(local_1e0);
    pTVar7 = (TPZGeoEl *)local_228._8_8_;
    if (((long *)local_1e0._0_8_ != (long *)0x0) && (*(long *)local_1e0._0_8_ != 0)) {
      TPZRefPattern::SideRefPattern((TPZRefPattern *)local_228,(int)*(long *)local_1e0._0_8_);
      if (((_func_int **)local_228._0_8_ == (_func_int **)0x0) ||
         (*(_func_int **)local_228._0_8_ == (_func_int *)0x0)) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
                   ,0xa17);
      }
      local_228._24_8_ = local_228._0_8_;
      LOCK();
      *(int *)(local_228._0_8_ + 8) = *(int *)(local_228._0_8_ + 8) + 1;
      UNLOCK();
      (**(code **)(*(long *)pTVar7 + 0x2a8))(pTVar7);
      TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer
                ((TPZAutoPointer<TPZRefPattern> *)(local_228 + 0x18));
      goto LAB_011ea158;
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"void TPZMHMeshControl::DivideWrap(TPZGeoEl *)");
    std::operator<<(poVar5," We expect elements to have refinement patterns\n");
  }
  TPZAutoPointer<TPZRefPattern>::~TPZAutoPointer((TPZAutoPointer<TPZRefPattern> *)local_1e0);
  TPZStack<TPZGeoEl_*,_10>::TPZStack((TPZStack<TPZGeoEl_*,_10> *)local_1e0);
  (**(code **)(*(long *)pTVar7 + 0x1c0))(pTVar7,local_1e0);
  for (lVar8 = 0; lVar8 < (long)local_1e0._16_8_; lVar8 = lVar8 + 1) {
    DivideWrap((TPZMHMeshControl *)local_228._16_8_,*(TPZGeoEl **)(local_1e0._8_8_ + lVar8 * 8));
  }
  TPZManVector<TPZGeoEl_*,_10>::~TPZManVector((TPZManVector<TPZGeoEl_*,_10> *)local_1e0);
LAB_011ea1f5:
  TPZManVector<TPZGeoElSide,_10>::~TPZManVector(&local_140.super_TPZManVector<TPZGeoElSide,_10>);
  return;
}

Assistant:

void TPZMHMeshControl::DivideWrap(TPZGeoEl *wrapelement)
{
    TPZGeoElSide gelside(wrapelement, wrapelement->NSides()-1);
    int dim = gelside.Dimension();
    TPZGeoElSide neighbour = gelside.Neighbour();
    while (neighbour != gelside) {
        if(neighbour.Element()->HasSubElement() && neighbour.NSubElements() > 1)
        {
            // verify if the subelements are connected to a wrap element
            TPZStack<TPZGeoElSide> subelsides;
            neighbour.GetSubElements2(subelsides);
            int nsub = subelsides.size();
            int nwrap = 0;
            int nsidesdim = 0;
            for(int isub = 0; isub<nsub; isub++)
            {
                if(subelsides[isub].Dimension() == dim)
                {
                    nsidesdim++;
                }
                else continue;
                if(HasWrapNeighbour(subelsides[isub])) nwrap++;
            }
            if(nwrap != 0 && nwrap != nsidesdim)
            {
                std::cout << "I don't understand\n";
                DebugStop();
            }
            if(nwrap != 0) return;
            if (neighbour.Side() == neighbour.NSides()-1) {
                TPZAutoPointer<TPZRefPattern> siderefpattern = neighbour.Element()->GetRefPattern();
                if(!siderefpattern)
                {
                    std::cout << __PRETTY_FUNCTION__ << " We expect elements to have refinement patterns\n";
//                    DebugStop();
                }
                else
                {
                    wrapelement->SetRefPattern(siderefpattern);
                }
            }
            else
            {
                TPZAutoPointer<TPZRefPattern> elrefpattern = neighbour.Element()->GetRefPattern();
                if(!elrefpattern)
                {
                    std::cout << __PRETTY_FUNCTION__ << " We expect elements to have refinement patterns\n";
//                    DebugStop();
                }
                else
                {
                    TPZAutoPointer<TPZRefPattern> siderefpattern = elrefpattern->SideRefPattern(neighbour.Side());
                    if(!siderefpattern) DebugStop();
                    wrapelement->SetRefPattern(siderefpattern);
                }
            }
            TPZStack<TPZGeoEl *> subels;

            wrapelement->Divide(subels);
#ifdef PZDEBUG
            if(subels.size() == 1)
            {
                DebugStop();
            }
#endif
#ifdef PZ_LOG
            if(loggerWRAP.isDebugEnabled())
            {
                std::stringstream sout;
                sout << std::endl;
                for (int is=0; is<subels.size(); is++) {
                    sout << "Created a son wrap element of " << wrapelement->Index() <<
                    " matid " << wrapelement->MaterialId() << " with index " <<
                    subels[is]->Index() << std::endl;
                }
                LOGPZ_DEBUG(loggerWRAP, sout.str())
            }
#endif
            for (int is=0; is<subels.size(); is++) {
                DivideWrap(subels[is]);
            }
            break;
        }
        neighbour = neighbour.Neighbour();
    }
}